

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::http::Method_testParse_Test::TestBody(Method_testParse_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2f8 [8];
  Message local_2f0 [15];
  allocator local_2e1;
  string local_2e0 [32];
  Method local_2c0 [2];
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_8;
  Message local_2a0 [15];
  allocator local_291;
  string local_290 [32];
  Method local_270 [2];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_7;
  Message local_250 [15];
  allocator local_241;
  string local_240 [32];
  Method local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_6;
  Message local_200 [15];
  allocator local_1f1;
  string local_1f0 [32];
  Method local_1d0 [2];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_5;
  Message local_1b0 [15];
  allocator local_1a1;
  string local_1a0 [32];
  Method local_180 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_4;
  Message local_160 [15];
  allocator local_151;
  string local_150 [32];
  Method local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110 [15];
  allocator local_101;
  string local_100 [32];
  Method local_e0 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0 [15];
  allocator local_b1;
  string local_b0 [32];
  Method local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_70 [8];
  Message local_68 [31];
  allocator local_49;
  string local_48 [32];
  Method local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Method_testParse_Test *this_local;
  
  local_28[1] = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"OPTIONS",&local_49);
  local_28[0] = jaegertracing::net::http::parseMethod(local_48);
  testing::internal::EqHelper<false>::
  Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
            ((EqHelper<false> *)local_20,"Method::OPTIONS","parseMethod(\"OPTIONS\")",local_28 + 1,
             local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(local_68);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_90[1] = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"GET",&local_b1);
    local_90[0] = jaegertracing::net::http::parseMethod(local_b0);
    testing::internal::EqHelper<false>::
    Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
              ((EqHelper<false> *)local_88,"Method::GET","parseMethod(\"GET\")",local_90 + 1,
               local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                 ,0x1b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_c0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_e0[1] = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"HEAD",&local_101);
      local_e0[0] = jaegertracing::net::http::parseMethod(local_100);
      testing::internal::EqHelper<false>::
      Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                ((EqHelper<false> *)local_d8,"Method::HEAD","parseMethod(\"HEAD\")",local_e0 + 1,
                 local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(local_110);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                   ,0x1c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_110);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_130[1] = 3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"POST",&local_151);
        local_130[0] = jaegertracing::net::http::parseMethod(local_150);
        testing::internal::EqHelper<false>::
        Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                  ((EqHelper<false> *)local_128,"Method::POST","parseMethod(\"POST\")",local_130 + 1
                   ,local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
        if (!bVar1) {
          testing::Message::Message(local_160);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                     ,0x1d,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_160)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(local_160);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_180[1] = 4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a0,"PUT",&local_1a1);
          local_180[0] = jaegertracing::net::http::parseMethod(local_1a0);
          testing::internal::EqHelper<false>::
          Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                    ((EqHelper<false> *)local_178,"Method::PUT","parseMethod(\"PUT\")",local_180 + 1
                     ,local_180);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar1) {
            testing::Message::Message(local_1b0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                       ,0x1e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,local_1b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(local_1b0);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_1d0[1] = 5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f0,"DELETE",&local_1f1);
            local_1d0[0] = jaegertracing::net::http::parseMethod(local_1f0);
            testing::internal::EqHelper<false>::
            Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                      ((EqHelper<false> *)local_1c8,"Method::DELETE","parseMethod(\"DELETE\")",
                       local_1d0 + 1,local_1d0);
            std::__cxx11::string::~string(local_1f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar1) {
              testing::Message::Message(local_200);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                         ,0x1f,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,local_200);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(local_200);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              local_220[1] = 6;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_240,"TRACE",&local_241);
              local_220[0] = jaegertracing::net::http::parseMethod(local_240);
              testing::internal::EqHelper<false>::
              Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                        ((EqHelper<false> *)local_218,"Method::TRACE","parseMethod(\"TRACE\")",
                         local_220 + 1,local_220);
              std::__cxx11::string::~string(local_240);
              std::allocator<char>::~allocator((allocator<char> *)&local_241);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
              if (!bVar1) {
                testing::Message::Message(local_250);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                           ,0x20,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,local_250);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(local_250);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_270[1] = 7;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_290,"CONNECT",&local_291);
                local_270[0] = jaegertracing::net::http::parseMethod(local_290);
                testing::internal::EqHelper<false>::
                Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                          ((EqHelper<false> *)local_268,"Method::CONNECT","parseMethod(\"CONNECT\")"
                           ,local_270 + 1,local_270);
                std::__cxx11::string::~string(local_290);
                std::allocator<char>::~allocator((allocator<char> *)&local_291);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_268);
                if (!bVar1) {
                  testing::Message::Message(local_2a0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                             ,0x21,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,local_2a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(local_2a0);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  local_2c0[1] = 8;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2e0,"post",&local_2e1);
                  local_2c0[0] = jaegertracing::net::http::parseMethod(local_2e0);
                  testing::internal::EqHelper<false>::
                  Compare<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                            ((EqHelper<false> *)local_2b8,"Method::EXTENSION",
                             "parseMethod(\"post\")",local_2c0 + 1,local_2c0);
                  std::__cxx11::string::~string(local_2e0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2b8);
                  if (!bVar1) {
                    testing::Message::Message(local_2f0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                               ,0x22,pcVar2);
                    testing::internal::AssertHelper::operator=(local_2f8,local_2f0);
                    testing::internal::AssertHelper::~AssertHelper(local_2f8);
                    testing::Message::~Message(local_2f0);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Method, testParse)
{
    ASSERT_EQ(Method::OPTIONS, parseMethod("OPTIONS"));
    ASSERT_EQ(Method::GET, parseMethod("GET"));
    ASSERT_EQ(Method::HEAD, parseMethod("HEAD"));
    ASSERT_EQ(Method::POST, parseMethod("POST"));
    ASSERT_EQ(Method::PUT, parseMethod("PUT"));
    ASSERT_EQ(Method::DELETE, parseMethod("DELETE"));
    ASSERT_EQ(Method::TRACE, parseMethod("TRACE"));
    ASSERT_EQ(Method::CONNECT, parseMethod("CONNECT"));
    ASSERT_EQ(Method::EXTENSION, parseMethod("post"));
}